

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O0

void __thiscall
RVO::KdTree::queryAgentTreeRecursive(KdTree *this,Agent *agent,float *rangeSq,size_t node)

{
  size_t sVar1;
  ulong uVar2;
  const_reference pvVar3;
  const_reference ppAVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float distSqRight;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  size_t sStack_30;
  float distSqLeft;
  size_t i;
  size_t node_local;
  float *rangeSq_local;
  Agent *agent_local;
  KdTree *this_local;
  
  i = node;
  node_local = (size_t)rangeSq;
  rangeSq_local = (float *)agent;
  agent_local = (Agent *)this;
  pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
           operator[](&this->agentTree_,node);
  sVar1 = pvVar3->end;
  pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
           operator[](&this->agentTree_,i);
  if (sVar1 - pvVar3->begin < 0xb) {
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    for (sStack_30 = pvVar3->begin; uVar2 = sStack_30,
        pvVar3 = std::
                 vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
                 operator[](&this->agentTree_,i), pfVar5 = rangeSq_local, uVar2 < pvVar3->end;
        sStack_30 = sStack_30 + 1) {
      ppAVar4 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                          (&this->agents_,sStack_30);
      Agent::insertAgentNeighbor((Agent *)pfVar5,*ppAVar4,(float *)node_local);
    }
  }
  else {
    local_38 = 0.0;
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,pvVar3->left);
    fVar7 = pvVar3->minX;
    local_3c = Vector2::x((Vector2 *)(rangeSq_local + 0x18));
    local_3c = fVar7 - local_3c;
    pfVar5 = std::max<float>(&local_38,&local_3c);
    fVar6 = sqr(*pfVar5);
    local_40 = 0.0;
    fVar7 = Vector2::x((Vector2 *)(rangeSq_local + 0x18));
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,pvVar3->left);
    local_44 = fVar7 - pvVar3->maxX;
    pfVar5 = std::max<float>(&local_40,&local_44);
    fVar8 = sqr(*pfVar5);
    local_48 = 0.0;
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,pvVar3->left);
    fVar7 = pvVar3->minY;
    local_4c = Vector2::y((Vector2 *)(rangeSq_local + 0x18));
    local_4c = fVar7 - local_4c;
    pfVar5 = std::max<float>(&local_48,&local_4c);
    fVar7 = sqr(*pfVar5);
    distSqRight = 0.0;
    fVar9 = Vector2::y((Vector2 *)(rangeSq_local + 0x18));
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,pvVar3->left);
    local_54 = fVar9 - pvVar3->maxY;
    pfVar5 = std::max<float>(&distSqRight,&local_54);
    local_34 = sqr(*pfVar5);
    local_34 = fVar6 + fVar8 + fVar7 + local_34;
    local_5c = 0.0;
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,pvVar3->right);
    fVar7 = pvVar3->minX;
    local_60 = Vector2::x((Vector2 *)(rangeSq_local + 0x18));
    local_60 = fVar7 - local_60;
    pfVar5 = std::max<float>(&local_5c,&local_60);
    fVar6 = sqr(*pfVar5);
    local_64 = 0.0;
    fVar7 = Vector2::x((Vector2 *)(rangeSq_local + 0x18));
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,pvVar3->right);
    local_68 = fVar7 - pvVar3->maxX;
    pfVar5 = std::max<float>(&local_64,&local_68);
    fVar8 = sqr(*pfVar5);
    local_6c = 0.0;
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,pvVar3->right);
    fVar7 = pvVar3->minY;
    local_70 = Vector2::y((Vector2 *)(rangeSq_local + 0x18));
    local_70 = fVar7 - local_70;
    pfVar5 = std::max<float>(&local_6c,&local_70);
    fVar7 = sqr(*pfVar5);
    local_74 = 0.0;
    fVar9 = Vector2::y((Vector2 *)(rangeSq_local + 0x18));
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,pvVar3->right);
    local_78 = fVar9 - pvVar3->maxY;
    pfVar5 = std::max<float>(&local_74,&local_78);
    local_58 = sqr(*pfVar5);
    pfVar5 = rangeSq_local;
    sVar1 = node_local;
    local_58 = fVar6 + fVar8 + fVar7 + local_58;
    if (local_58 <= local_34) {
      if (local_58 < *(float *)node_local) {
        pvVar3 = std::
                 vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
                 operator[](&this->agentTree_,i);
        queryAgentTreeRecursive(this,(Agent *)pfVar5,(float *)sVar1,pvVar3->right);
        pfVar5 = rangeSq_local;
        sVar1 = node_local;
        if (local_34 < *(float *)node_local) {
          pvVar3 = std::
                   vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
                   operator[](&this->agentTree_,i);
          queryAgentTreeRecursive(this,(Agent *)pfVar5,(float *)sVar1,pvVar3->left);
        }
      }
    }
    else if (local_34 < *(float *)node_local) {
      pvVar3 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
               ::operator[](&this->agentTree_,i);
      queryAgentTreeRecursive(this,(Agent *)pfVar5,(float *)sVar1,pvVar3->left);
      pfVar5 = rangeSq_local;
      sVar1 = node_local;
      if (local_58 < *(float *)node_local) {
        pvVar3 = std::
                 vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
                 operator[](&this->agentTree_,i);
        queryAgentTreeRecursive(this,(Agent *)pfVar5,(float *)sVar1,pvVar3->right);
      }
    }
  }
  return;
}

Assistant:

void KdTree::queryAgentTreeRecursive(Agent *agent, float &rangeSq, size_t node) const
	{
		if (agentTree_[node].end - agentTree_[node].begin <= MAX_LEAF_SIZE) {
			for (size_t i = agentTree_[node].begin; i < agentTree_[node].end; ++i) {
				agent->insertAgentNeighbor(agents_[i], rangeSq);
			}
		}
		else {
			const float distSqLeft = sqr(std::max(0.0f, agentTree_[agentTree_[node].left].minX - agent->position_.x())) + sqr(std::max(0.0f, agent->position_.x() - agentTree_[agentTree_[node].left].maxX)) + sqr(std::max(0.0f, agentTree_[agentTree_[node].left].minY - agent->position_.y())) + sqr(std::max(0.0f, agent->position_.y() - agentTree_[agentTree_[node].left].maxY));

			const float distSqRight = sqr(std::max(0.0f, agentTree_[agentTree_[node].right].minX - agent->position_.x())) + sqr(std::max(0.0f, agent->position_.x() - agentTree_[agentTree_[node].right].maxX)) + sqr(std::max(0.0f, agentTree_[agentTree_[node].right].minY - agent->position_.y())) + sqr(std::max(0.0f, agent->position_.y() - agentTree_[agentTree_[node].right].maxY));

			if (distSqLeft < distSqRight) {
				if (distSqLeft < rangeSq) {
					queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].left);

					if (distSqRight < rangeSq) {
						queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].right);
					}
				}
			}
			else {
				if (distSqRight < rangeSq) {
					queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].right);

					if (distSqLeft < rangeSq) {
						queryAgentTreeRecursive(agent, rangeSq, agentTree_[node].left);
					}
				}
			}

		}
	}